

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialDistribution.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::section::Type<5>::PartialDistribution::PartialDistribution
          (PartialDistribution *this,PartialDistribution *param_1)

{
  TabulationRecord::TabulationRecord((TabulationRecord *)this,(TabulationRecord *)param_1);
  std::__detail::__variant::
  _Copy_ctor_base<false,_njoy::ENDFtk::section::Type<5>::TabulatedSpectrum,_njoy::ENDFtk::section::Type<5>::GeneralEvaporationSpectrum,_njoy::ENDFtk::section::Type<5>::MaxwellianFissionSpectrum,_njoy::ENDFtk::section::Type<5>::EvaporationSpectrum,_njoy::ENDFtk::section::Type<5>::WattSpectrum,_njoy::ENDFtk::section::Type<5>::MadlandNixSpectrum>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_njoy::ENDFtk::section::Type<5>::TabulatedSpectrum,_njoy::ENDFtk::section::Type<5>::GeneralEvaporationSpectrum,_njoy::ENDFtk::section::Type<5>::MaxwellianFissionSpectrum,_njoy::ENDFtk::section::Type<5>::EvaporationSpectrum,_njoy::ENDFtk::section::Type<5>::WattSpectrum,_njoy::ENDFtk::section::Type<5>::MadlandNixSpectrum>
                     *)&this->distribution_,
                    (_Copy_ctor_base<false,_njoy::ENDFtk::section::Type<5>::TabulatedSpectrum,_njoy::ENDFtk::section::Type<5>::GeneralEvaporationSpectrum,_njoy::ENDFtk::section::Type<5>::MaxwellianFissionSpectrum,_njoy::ENDFtk::section::Type<5>::EvaporationSpectrum,_njoy::ENDFtk::section::Type<5>::WattSpectrum,_njoy::ENDFtk::section::Type<5>::MadlandNixSpectrum>
                     *)&param_1->distribution_);
  return;
}

Assistant:

class ENDFTK_PYTHON_EXPORT PartialDistribution {

  Probability probability_;
  Distribution distribution_;

  /* auxiliary functions */
  #include "ENDFtk/section/5/PartialDistribution/src/verifyLF.hpp"
  #include "ENDFtk/section/5/PartialDistribution/src/readPartialDistribution.hpp"

public:

  /* constructor */
  #include "ENDFtk/section/5/PartialDistribution/src/ctor.hpp"

  /* get methods */

  /**
   *  @brief Return the constant that defines the upper energy
   *         limit E - U for the secondary particle's energy E'
   */
  double U() const { return this->probability_.U(); }

  /**
   *  @brief Return the constant that defines the upper energy
   *         limit E - U for the secondary particle's energy E'
   */
  double energyLimitConstant() const { return this->U(); }

  /**
   *  @brief Return the probability
   */
  const Probability& probability() const { return this->probability_; }

  /**
   *  @brief Return the distribution
   */
  const Distribution& distribution() const { return this->distribution_; }

  #include "ENDFtk/section/5/PartialDistribution/src/NC.hpp"
  #include "ENDFtk/section/5/PartialDistribution/src/print.hpp"
}